

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O3

void helper_sve_fcadd_s_aarch64(void *vd,void *vn,void *vm,void *vg,void *vs,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  float32 fVar3;
  float32 fVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar5 = (ulong)((desc & 0x1f) * 8 + 8);
  uVar6 = (desc & 0x400) << 0x15;
  do {
    uVar2 = *(ulong *)((long)vg + ((long)(uVar5 - 1) >> 6) * 8);
    uVar7 = uVar5;
    do {
      uVar5 = uVar7 - 8;
      fVar4 = *(float32 *)((long)vn + (uVar7 - 4));
      uVar1 = *(uint *)((long)vm + (uVar7 - 8));
      if ((uVar2 >> ((uint)uVar5 & 0x3f) & 1) != 0) {
        fVar3 = float32_add_aarch64(*(float32 *)((long)vn + (uVar7 - 8)),
                                    (*(uint *)((long)vm + (uVar7 - 4)) ^ uVar6) + 0x80000000,
                                    (float_status *)vs);
        *(float32 *)((long)vd + (uVar7 - 8)) = fVar3;
      }
      if ((uVar2 >> (uVar7 - 4 & 0x3f) & 1) != 0) {
        fVar4 = float32_add_aarch64(fVar4,uVar1 ^ uVar6,(float_status *)vs);
        *(float32 *)((long)vd + (uVar7 - 4)) = fVar4;
      }
      uVar7 = uVar5;
    } while ((uVar5 & 0x3f) != 0);
  } while (uVar5 != 0);
  return;
}

Assistant:

void HELPER(sve_fcadd_s)(void *vd, void *vn, void *vm, void *vg,
                         void *vs, uint32_t desc)
{
    intptr_t j, i = simd_oprsz(desc);
    uint64_t *g = vg;
    float32 neg_imag = float32_set_sign(0, simd_data(desc));
    float32 neg_real = float32_chs(neg_imag);

    do {
        uint64_t pg = g[(i - 1) >> 6];
        do {
            float32 e0, e1, e2, e3;

            /* I holds the real index; J holds the imag index.  */
            j = i - sizeof(float32);
            i -= 2 * sizeof(float32);

            e0 = *(float32 *)((char *)vn + H1_2(i));
            e1 = *(float32 *)((char *)vm + H1_2(j)) ^ neg_real;
            e2 = *(float32 *)((char *)vn + H1_2(j));
            e3 = *(float32 *)((char *)vm + H1_2(i)) ^ neg_imag;

            if (likely((pg >> (i & 63)) & 1)) {
                *(float32 *)((char *)vd + H1_2(i)) = float32_add(e0, e1, vs);
            }
            if (likely((pg >> (j & 63)) & 1)) {
                *(float32 *)((char *)vd + H1_2(j)) = float32_add(e2, e3, vs);
            }
        } while (i & 63);
    } while (i != 0);
}